

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

uint32_t __thiscall cfd::core::Transaction::GetWeight(Transaction *this)

{
  void *pvVar1;
  uint32_t uVar2;
  
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if ((*(long *)((long)pvVar1 + 0x10) == 0) && (*(long *)((long)pvVar1 + 0x28) == 0)) {
    return 0x28;
  }
  uVar2 = AbstractTransaction::GetWeight(&this->super_AbstractTransaction);
  return uVar2;
}

Assistant:

uint32_t Transaction::GetWeight() const {
  size_t weight = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  // If both input / output are 0, libwally misidentifies as ElementsTransaction
  if ((tx_pointer->num_inputs == 0) && (tx_pointer->num_outputs == 0)) {
    weight = static_cast<size_t>(kTransactionMinimumSize) * 4;
  } else {
    weight = AbstractTransaction::GetWeight();
  }
  return static_cast<uint32_t>(weight);
}